

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O3

long __thiscall bhf::ads::RTimeAccess::SetSharedCores(RTimeAccess *this,uint32_t sharedCores)

{
  long lVar1;
  AmsAddr systemService;
  RTimeCpuSettings oldSettings;
  uint32_t local_44;
  AmsAddr local_40;
  RTimeCpuSettings local_38;
  
  local_44 = sharedCores;
  ReadCpuSettings(&local_38,this);
  if (sharedCores == 0xffffffff) {
    if (local_38.nNonWinCPUs != 0) goto LAB_0011d743;
  }
  else if (local_38.nWinCPUs != sharedCores) {
LAB_0011d743:
    local_40.netId.b._4_2_ = *(undefined2 *)((this->device).m_Addr.netId.b + 4);
    local_40.netId.b._0_4_ = *(undefined4 *)(this->device).m_Addr.netId.b;
    local_40.port = 10000;
    lVar1 = AdsDevice::GetLocalPort(&this->device);
    lVar1 = AdsSyncWriteReqEx(lVar1,&local_40,0x4b0,0,4,&local_44);
    return lVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Requested shared core configuration already active, no change applied.\n",0x47);
  return 0x70f;
}

Assistant:

long RTimeAccess::SetSharedCores(const uint32_t sharedCores) const
{
    const auto oldSettings = ReadCpuSettings();

    if (sharedCores == std::numeric_limits<uint32_t>::max()) {
        // 0xffffffff means RESET -> no isolated cores, all shared.
        if (0 == oldSettings.nNonWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    } else {
        // All other values mean limit the number of shared cores -> use remaining cores as isolated.
        if (sharedCores == oldSettings.nWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    }
    // We have to apply changes to the current core configuration. For this we
    // have to talk to a different AdsDevice, the system service. Now, it is handy
    // that ADS doesn't really implement "connections" so we can just use the AMS
    // port of our RTimeAccess object, but adust the target AmsPort.
    const AmsAddr systemService { device.m_Addr.netId, 10000 };
    return AdsSyncWriteReqEx(device.GetLocalPort(),
                             &systemService,
                             SYSTEMSERVICE_SETNUMPROC,
                             0,
                             sizeof(sharedCores),
                             &sharedCores);
}